

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

HeadToLinkImplementationMap * __thiscall
cmGeneratorTarget::GetHeadToLinkImplementationMap(cmGeneratorTarget *this,string *config)

{
  mapped_type *pmVar1;
  string local_38;
  string *local_18;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_18 = config;
  config_local = (string *)this;
  cmsys::SystemTools::UpperCase(&local_38,config);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap>_>_>
           ::operator[](&this->LinkImplMap,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return pmVar1;
}

Assistant:

cmGeneratorTarget::HeadToLinkImplementationMap&
cmGeneratorTarget::GetHeadToLinkImplementationMap(
  std::string const& config) const
{
  return this->LinkImplMap[cmSystemTools::UpperCase(config)];
}